

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_measurement_strings.cpp
# Opt level: O0

void __thiscall
MeasurementStrings_interesting_Test::TestBody(MeasurementStrings_interesting_Test *this)

{
  bool bVar1;
  uint64_t match_flags;
  char *message;
  AssertHelper local_a0;
  Message local_98;
  precise_unit local_90;
  precise_unit local_80;
  undefined1 local_70 [8];
  AssertionResult gtest_ar;
  allocator local_49;
  string local_48;
  undefined1 local_28 [8];
  precise_measurement pm;
  MeasurementStrings_interesting_Test *this_local;
  
  pm.units_._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"nanometre",&local_49);
  match_flags = units::getDefaultFlags();
  units::measurement_from_string((precise_measurement *)local_28,&local_48,match_flags);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  local_80 = units::precise_measurement::as_unit((precise_measurement *)local_28);
  local_90 = units::precise_unit::operator*
                       ((precise_unit *)units::precise::nano,(precise_unit *)units::precise::m);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_70,"pm.as_unit()","precise::nano * precise::m",&local_80,&local_90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(&local_98);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_70);
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement_strings.cpp"
               ,0x43,message);
    testing::internal::AssertHelper::operator=(&local_a0,&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    testing::Message::~Message(&local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  return;
}

Assistant:

TEST(MeasurementStrings, interesting)
{
    auto pm = measurement_from_string("nanometre");
    EXPECT_EQ(pm.as_unit(), precise::nano * precise::m);
}